

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endec_pair_tester.hxx
# Opt level: O0

void __thiscall
cryptox::tests::endec_pair_tester<cryptox::symmetric_algorithm<&EVP_des_cfb8>_>::endec_pair_tester
          (endec_pair_tester<cryptox::symmetric_algorithm<&EVP_des_cfb8>_> *this)

{
  const_iterator cVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  endec_pair_tester<cryptox::symmetric_algorithm<&EVP_des_cfb8>_> *this_local;
  
  detail::make_random_vector(&this->key,0x20);
  detail::make_random_vector(&this->salt,0x20);
  detail::make_random_vector(&this->iv,0x20);
  cVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&this->key);
  cVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&this->key);
  cVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&this->iv);
  cVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&this->iv);
  encryptor<cryptox::symmetric_algorithm<&EVP_des_cfb8>>::
  encryptor<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((encryptor<cryptox::symmetric_algorithm<&EVP_des_cfb8>> *)&this->encryptor,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )cVar1._M_current,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )cVar2._M_current,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )cVar3._M_current,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )cVar4._M_current);
  cVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&this->key);
  cVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&this->key);
  cVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&this->iv);
  cVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&this->iv);
  decryptor<cryptox::symmetric_algorithm<&EVP_des_cfb8>>::
  decryptor<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((decryptor<cryptox::symmetric_algorithm<&EVP_des_cfb8>> *)&this->decryptor,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )cVar1._M_current,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )cVar2._M_current,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )cVar3._M_current,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )cVar4._M_current);
  return;
}

Assistant:

endec_pair_tester()
		 : key(detail::make_random_vector()),
		   salt(detail::make_random_vector()),
		     iv(detail::make_random_vector()),
		  encryptor(key.begin(), key.end(), iv.begin(), iv.end()),
		  decryptor(key.begin(), key.end(), iv.begin(), iv.end()) {
		}